

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_aggnonce_parse
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *nonce,uchar *in66)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  int i;
  secp256k1_ge ges [2];
  secp256k1_ge *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar2;
  uchar *in_stack_ffffffffffffff40;
  secp256k1_ge *in_stack_ffffffffffffff48;
  int local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (char *)in_stack_ffffffffffffff18);
    local_4 = 0;
  }
  else {
    for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
      iVar1 = secp256k1_musig_ge_parse_ext(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      if (iVar1 == 0) {
        return 0;
      }
    }
    secp256k1_musig_aggnonce_save
              ((secp256k1_musig_aggnonce *)CONCAT44(iVar2,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_musig_aggnonce_parse(const secp256k1_context* ctx, secp256k1_musig_aggnonce* nonce, const unsigned char *in66) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(in66 != NULL);

    for (i = 0; i < 2; i++) {
        if (!secp256k1_musig_ge_parse_ext(&ges[i], &in66[33*i])) {
            return 0;
        }
    }
    secp256k1_musig_aggnonce_save(nonce, ges);
    return 1;
}